

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

NodeRef * __thiscall c4::yml::Tree::operator[](NodeRef *__return_storage_ptr__,Tree *this,size_t i)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  size_t node;
  NodeRef *pNVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  csubstr cVar12;
  char *pcStack_88;
  size_t local_80;
  char msg [68];
  
  bVar11 = 0;
  node = root_id(this);
  if (node == 0xffffffffffffffff) {
    pcVar9 = "check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)";
    pcVar10 = msg;
    for (lVar8 = 0x44; lVar8 != 0; lVar8 = lVar8 + -1) {
      *pcVar10 = *pcVar9;
      pcVar9 = pcVar9 + (ulong)bVar11 * -2 + 1;
      pcVar10 = pcVar10 + (ulong)bVar11 * -2 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        pNVar5 = (NodeRef *)(*pcVar2)();
        return pNVar5;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar12 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_80 = cVar12.len;
    pcStack_88 = cVar12.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x50c4) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x50c4) << 0x40,8);
    LVar3.name.str = pcStack_88;
    LVar3.name.len = local_80;
    (*p_Var1)(msg,0x44,LVar3,(this->m_callbacks).m_user_data);
  }
  sVar6 = child(this,node,i);
  if (sVar6 != 0xffffffffffffffff) {
    node = sVar6;
  }
  sVar7 = 0xffffffffffffffff;
  if (sVar6 == 0xffffffffffffffff) {
    sVar7 = i;
  }
  __return_storage_ptr__->m_tree = this;
  __return_storage_ptr__->m_id = node;
  (__return_storage_ptr__->m_seed).str = (char *)0x0;
  (__return_storage_ptr__->m_seed).len = sVar7;
  return __return_storage_ptr__;
}

Assistant:

NodeRef Tree::operator[] (size_t i)
{
    return rootref()[i];
}